

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::declareArray
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TType *type,TSymbol **symbol)

{
  TType *identifier_00;
  TString *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  TSymbol *pTVar6;
  TVariable *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar7;
  TType *this_01;
  TType *existingType;
  TSymbol **ppTStack_30;
  bool currentScope;
  TSymbol **symbol_local;
  TType *type_local;
  TString *identifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  undefined4 extraout_var_01;
  
  ppTStack_30 = symbol;
  symbol_local = (TSymbol **)type;
  type_local = (TType *)identifier;
  identifier_local = (TString *)loc;
  loc_local = (TSourceLoc *)this;
  if (*symbol == (TSymbol *)0x0) {
    pTVar6 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,(bool *)0x0,
                                (bool *)((long)&existingType + 7),(int *)0x0);
    *ppTStack_30 = pTVar6;
    if (((*ppTStack_30 != (TSymbol *)0x0) &&
        (identifier = (TString *)type_local, bVar2 = builtInName(this,(TString *)type_local), bVar2)
        ) && (bVar2 = TSymbolTable::atBuiltInLevel((this->super_TParseContextBase).symbolTable),
             !bVar2)) {
      *ppTStack_30 = (TSymbol *)0x0;
      return;
    }
    if ((*ppTStack_30 == (TSymbol *)0x0) || ((existingType._7_1_ & 1) == 0)) {
      this_00 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)identifier);
      TVariable::TVariable(this_00,(TString *)type_local,(TType *)symbol_local,false);
      *ppTStack_30 = (TSymbol *)this_00;
      TSymbolTable::insert((this->super_TParseContextBase).symbolTable,*ppTStack_30);
      bVar2 = TSymbolTable::atGlobalLevel((this->super_TParseContextBase).symbolTable);
      if (bVar2) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                  (this,*ppTStack_30);
      }
      bVar2 = TSymbolTable::atBuiltInLevel((this->super_TParseContextBase).symbolTable);
      if (bVar2) {
        return;
      }
      bVar2 = isIoResizeArray(this,(TType *)symbol_local);
      pTVar1 = identifier_local;
      if (!bVar2) {
        iVar3 = (*(*ppTStack_30)->_vptr_TSymbol[0xd])();
        fixIoArraySize(this,(TSourceLoc *)pTVar1,(TType *)CONCAT44(extraout_var,iVar3));
        return;
      }
      std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::push_back
                (&(this->ioArraySymbolResizeList).
                  super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>,
                 ppTStack_30);
      checkIoArraysConsistency(this,(TSourceLoc *)identifier_local,true);
      return;
    }
    iVar3 = (*(*ppTStack_30)->_vptr_TSymbol[0xb])();
    pTVar1 = identifier_local;
    if (CONCAT44(extraout_var_00,iVar3) != 0) {
      pcVar7 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)type_local);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar1,"cannot redeclare a user-block member array",pcVar7,"");
      *ppTStack_30 = (TSymbol *)0x0;
      return;
    }
  }
  pTVar1 = identifier_local;
  if (*ppTStack_30 == (TSymbol *)0x0) {
    pcVar7 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)type_local);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar1,"array variable name expected",pcVar7,"");
  }
  else {
    iVar3 = (*(*ppTStack_30)->_vptr_TSymbol[0xd])();
    this_01 = (TType *)CONCAT44(extraout_var_01,iVar3);
    uVar4 = (*this_01->_vptr_TType[0x1d])();
    pTVar1 = identifier_local;
    if ((uVar4 & 1) == 0) {
      pcVar7 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)type_local);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar1,"redeclaring non-array as array",pcVar7,"");
    }
    else {
      bVar2 = TType::sameElementType(this_01,(TType *)symbol_local,(int *)0x0,(int *)0x0);
      pTVar1 = identifier_local;
      if (bVar2) {
        bVar2 = TType::sameInnerArrayness(this_01,(TType *)symbol_local);
        pTVar1 = identifier_local;
        if (bVar2) {
          uVar4 = (*this_01->_vptr_TType[0x1e])();
          pTVar1 = identifier_local;
          identifier_00 = type_local;
          if ((uVar4 & 1) == 0) {
            iVar3 = (*(code *)(*symbol_local)[2].uniqueId)();
            arrayLimitCheck(this,(TSourceLoc *)pTVar1,(TString *)identifier_00,iVar3);
            TType::updateArraySizes(this_01,(TType *)symbol_local);
            bVar2 = isIoResizeArray(this,(TType *)symbol_local);
            if (bVar2) {
              checkIoArraysConsistency(this,(TSourceLoc *)identifier_local,false);
            }
          }
          else {
            bVar2 = isIoResizeArray(this,(TType *)symbol_local);
            if (bVar2) {
              iVar3 = (*this_01->_vptr_TType[0xf])();
              iVar5 = (*(code *)(*symbol_local)[2].uniqueId)();
              if (iVar3 == iVar5) {
                return;
              }
            }
            pTVar1 = identifier_local;
            pcVar7 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)type_local);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar1,"redeclaration of array with size",pcVar7,"");
          }
        }
        else {
          pcVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)type_local);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,pTVar1,"redeclaration of array with a different array dimensions or sizes"
                     ,pcVar7,"");
        }
      }
      else {
        pcVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)type_local);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar1,"redeclaration of array with a different element type",pcVar7,"");
      }
    }
  }
  return;
}

Assistant:

void TParseContext::declareArray(const TSourceLoc& loc, const TString& identifier, const TType& type, TSymbol*& symbol)
{
    if (symbol == nullptr) {
        bool currentScope;
        symbol = symbolTable.find(identifier, nullptr, &currentScope);

        if (symbol && builtInName(identifier) && ! symbolTable.atBuiltInLevel()) {
            // bad shader (errors already reported) trying to redeclare a built-in name as an array
            symbol = nullptr;
            return;
        }
        if (symbol == nullptr || ! currentScope) {
            //
            // Successfully process a new definition.
            // (Redeclarations have to take place at the same scope; otherwise they are hiding declarations)
            //
            symbol = new TVariable(&identifier, type);
            symbolTable.insert(*symbol);
            if (symbolTable.atGlobalLevel())
                trackLinkage(*symbol);

            if (! symbolTable.atBuiltInLevel()) {
                if (isIoResizeArray(type)) {
                    ioArraySymbolResizeList.push_back(symbol);
                    checkIoArraysConsistency(loc, true);
                } else
                    fixIoArraySize(loc, symbol->getWritableType());
            }

            return;
        }
        if (symbol->getAsAnonMember()) {
            error(loc, "cannot redeclare a user-block member array", identifier.c_str(), "");
            symbol = nullptr;
            return;
        }
    }

    //
    // Process a redeclaration.
    //

    if (symbol == nullptr) {
        error(loc, "array variable name expected", identifier.c_str(), "");
        return;
    }

    // redeclareBuiltinVariable() should have already done the copyUp()
    TType& existingType = symbol->getWritableType();

    if (! existingType.isArray()) {
        error(loc, "redeclaring non-array as array", identifier.c_str(), "");
        return;
    }

    if (! existingType.sameElementType(type)) {
        error(loc, "redeclaration of array with a different element type", identifier.c_str(), "");
        return;
    }

    if (! existingType.sameInnerArrayness(type)) {
        error(loc, "redeclaration of array with a different array dimensions or sizes", identifier.c_str(), "");
        return;
    }

    if (existingType.isSizedArray()) {
        // be more leniant for input arrays to geometry shaders and tessellation control outputs, where the redeclaration is the same size
        if (! (isIoResizeArray(type) && existingType.getOuterArraySize() == type.getOuterArraySize()))
            error(loc, "redeclaration of array with size", identifier.c_str(), "");
        return;
    }

    arrayLimitCheck(loc, identifier, type.getOuterArraySize());

    existingType.updateArraySizes(type);

    if (isIoResizeArray(type))
        checkIoArraysConsistency(loc);
}